

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<Fad<float>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<float>_> *Sort)

{
  double dVar1;
  int64_t iVar2;
  Fad<float> *pFVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  long col;
  long lVar5;
  long lVar6;
  long row;
  undefined1 local_298 [16];
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_288;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  undefined1 local_248 [16];
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *local_238;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_230;
  Fad<float> exps;
  undefined1 local_200 [16];
  Fad<float> *local_1f0;
  Fad<float> *local_1e8;
  TPZVec<Fad<float>_> *local_1e0;
  long local_1d8;
  int64_t local_1d0;
  double *local_1c8;
  long *local_1c0;
  long local_1b8;
  Fad<float> *local_1b0;
  Fad<float> *local_1a8;
  Fad<float> **local_1a0;
  Fad<float> *local_198;
  Fad<float> maxval;
  Fad<float> sint;
  Fad<float> cost;
  Fad<float> Spq;
  Fad<float> aux2;
  Fad<float> aux;
  Fad<float> theta;
  Fad<float> Sqq;
  Fad<float> Spp;
  Fad<float> res;
  Fad<float> local_50;
  
  theta._0_8_ = &myset;
  myset._M_t._M_impl._0_4_ = 0x40000000;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       ((ulong)myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 0xffffffff00000000);
  maxval.val_ = (float)*tol;
  theta.dx_._0_8_ = &maxval;
  maxval.dx_.num_elts = 0;
  maxval.dx_.ptr_to_data = (float *)0x0;
  maxval.defaultVal = 0.0;
  local_1e0 = Sort;
  local_1c8 = tol;
  local_1c0 = numiterations;
  Fad<float>::Fad<FadBinaryMul<Fad<float>,Fad<float>>>
            (&res,(FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)&theta);
  Fad<float>::~Fad(&maxval);
  Fad<float>::~Fad((Fad<float> *)&myset);
  local_1d0 = (this->super_TPZBaseMatrix).fRow;
  Fad<float>::Fad(&maxval);
  Fad<float>::Fad(&theta);
  Fad<float>::Fad(&cost);
  Fad<float>::Fad(&sint);
  Fad<float>::Fad(&aux);
  Fad<float>::Fad(&aux2);
  Fad<float>::Fad(&Spp);
  Fad<float>::Fad(&Sqq);
  Fad<float>::Fad(&Spq);
  local_1b8 = 0;
  local_1d8 = 0;
  if (0 < local_1d0) {
    local_1d8 = local_1d0;
  }
  lVar6 = -1;
  row = lVar6;
  for (; local_1b8 < *local_1c0; local_1b8 = local_1b8 + 1) {
    myset._M_t._M_impl._0_8_ = 0;
    Fad<float>::operator=<double,_nullptr>(&maxval,(double *)&myset);
    for (lVar5 = 0; lVar5 != local_1d8; lVar5 = lVar5 + 1) {
      for (col = 0; lVar5 != col; col = col + 1) {
        pFVar3 = operator()(this,lVar5,col);
        if (ABS(maxval.val_) < ABS(pFVar3->val_)) {
          pFVar3 = operator()(this,lVar5,col);
          myset._M_t._M_impl._0_8_ =
               CONCAT44(myset._M_t._M_impl._4_4_,pFVar3->val_) & 0xffffffff7fffffff;
          Fad<float>::operator=<float,_nullptr>(&maxval,(float *)&myset);
          lVar6 = col;
          row = lVar5;
        }
      }
    }
    Fad<float>::operator=(&res,&maxval);
    if ((double)ABS(res.val_) < *local_1c8) break;
    myset._M_t._M_impl._0_4_ = 0x3f000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 0xffffffff00000000);
    exps.val_ = 2.0;
    exps.dx_._0_8_ = exps.dx_._0_8_ & 0xffffffff00000000;
    exps.dx_.ptr_to_data = (float *)0x0;
    exps.defaultVal = 0.0;
    local_298._8_8_ = operator()(this,row,lVar6);
    local_298._0_8_ = &exps;
    pFVar3 = operator()(this,lVar6,lVar6);
    local_230.fadexpr_.right_ = operator()(this,row,row);
    local_238 = &local_230;
    local_288.fadexpr_.right_ = (Fad<float> *)local_248;
    local_288.fadexpr_.left_ = (Fad<float> *)&myset;
    local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_298;
    local_230.fadexpr_.left_ = pFVar3;
    Fad<float>::operator=
              (&theta,(FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                       *)&local_288);
    Fad<float>::~Fad(&exps);
    Fad<float>::~Fad((Fad<float> *)&myset);
    cos<float>((FadExpr<FadFuncCos<Fad<float>_>_> *)&myset,&theta);
    Fad<float>::operator=(&cost,(FadExpr<FadFuncCos<Fad<float>_>_> *)&myset);
    Fad<float>::~Fad((Fad<float> *)&myset._M_t._M_impl.super__Rb_tree_header);
    sin<float>((FadExpr<FadFuncSin<Fad<float>_>_> *)&myset,&theta);
    Fad<float>::operator=(&sint,(FadExpr<FadFuncSin<Fad<float>_>_> *)&myset);
    Fad<float>::~Fad((Fad<float> *)&myset._M_t._M_impl.super__Rb_tree_header);
    for (lVar5 = 0; local_1d8 != lVar5; lVar5 = lVar5 + 1) {
      if ((row != lVar5) && (lVar6 != lVar5)) {
        pFVar3 = operator()(this,lVar5,row);
        Fad<float>::Fad((Fad<float> *)&myset,&cost);
        local_288.fadexpr_.left_ = pFVar3;
        local_288.fadexpr_.right_ = (Fad<float> *)&myset;
        pFVar3 = operator()(this,lVar5,lVar6);
        Fad<float>::Fad(&exps,&sint);
        local_248._0_8_ = &local_288;
        local_298._0_8_ = pFVar3;
        local_298._8_8_ = &exps;
        local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_298;
        Fad<float>::operator=
                  (&aux,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                         *)local_248);
        Fad<float>::~Fad(&exps);
        Fad<float>::~Fad((Fad<float> *)&myset);
        pFVar3 = operator()(this,lVar5,row);
        Fad<float>::Fad((Fad<float> *)&myset,&sint);
        local_288.fadexpr_.left_ = pFVar3;
        local_288.fadexpr_.right_ = (Fad<float> *)&myset;
        pFVar3 = operator()(this,lVar5,lVar6);
        Fad<float>::Fad(&exps,&cost);
        local_248._0_8_ = &local_288;
        local_298._0_8_ = pFVar3;
        local_298._8_8_ = &exps;
        local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_298;
        Fad<float>::operator=
                  (&aux2,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                          *)local_248);
        Fad<float>::~Fad(&exps);
        Fad<float>::~Fad((Fad<float> *)&myset);
        pFVar3 = operator()(this,lVar5,row);
        Fad<float>::operator=(pFVar3,&aux);
        pFVar3 = operator()(this,row,lVar5);
        Fad<float>::operator=(pFVar3,&aux);
        pFVar3 = operator()(this,lVar5,lVar6);
        Fad<float>::operator=(pFVar3,&aux2);
        pFVar3 = operator()(this,lVar6,lVar5);
        Fad<float>::operator=(pFVar3,&aux2);
      }
    }
    local_298._0_8_ = operator()(this,row,row);
    myset._M_t._M_impl._0_4_ = 0x40000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 0xffffffff00000000);
    local_298._8_8_ = &cost;
    local_288.fadexpr_.left_ = (Fad<float> *)local_298;
    local_288.fadexpr_.right_ = &cost;
    local_200._8_8_ = operator()(this,row,lVar6);
    local_200._0_8_ = &myset;
    local_1f0 = (Fad<float> *)local_200;
    local_230.fadexpr_.left_ = (Fad<float> *)&local_1f0;
    local_248._0_8_ = &local_288;
    local_248._8_8_ = &local_230;
    local_230.fadexpr_.right_ = &cost;
    local_1e8 = &sint;
    local_1b0 = operator()(this,lVar6,lVar6);
    local_1a0 = &local_1b0;
    exps._0_8_ = local_248;
    exps.dx_._0_8_ = &local_1a0;
    local_1a8 = &sint;
    local_198 = &sint;
    Fad<float>::operator=
              (&Spp,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                     *)&exps);
    Fad<float>::~Fad((Fad<float> *)&myset);
    local_298._0_8_ = operator()(this,row,row);
    myset._M_t._M_impl._0_4_ = 0x40000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 0xffffffff00000000);
    local_298._8_8_ = &sint;
    local_288.fadexpr_.left_ = (Fad<float> *)local_298;
    local_288.fadexpr_.right_ = &sint;
    local_200._8_8_ = operator()(this,row,lVar6);
    local_200._0_8_ = &myset;
    local_1f0 = (Fad<float> *)local_200;
    local_230.fadexpr_.left_ = (Fad<float> *)&local_1f0;
    local_248._0_8_ = &local_288;
    local_248._8_8_ = &local_230;
    local_230.fadexpr_.right_ = &cost;
    local_1e8 = &sint;
    local_1b0 = operator()(this,lVar6,lVar6);
    local_1a0 = &local_1b0;
    exps._0_8_ = local_248;
    exps.dx_._0_8_ = &local_1a0;
    local_1a8 = &cost;
    local_198 = &cost;
    Fad<float>::operator=
              (&Sqq,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                     *)&exps);
    Fad<float>::~Fad((Fad<float> *)&myset);
    pFVar3 = operator()(this,row,row);
    local_288.fadexpr_.right_ = operator()(this,lVar6,lVar6);
    local_248._0_8_ = &local_288;
    exps._0_8_ = local_248;
    local_288.fadexpr_.left_ = pFVar3;
    local_248._8_8_ = &cost;
    exps.dx_._0_8_ = &sint;
    local_298._0_8_ = operator()(this,row,lVar6);
    local_230.fadexpr_.left_ = (Fad<float> *)&local_1f0;
    local_230.fadexpr_.right_ = (Fad<float> *)local_200;
    local_298._8_8_ = &local_230;
    myset._M_t._M_impl._0_8_ = &exps;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_298;
    local_200._0_8_ = &sint;
    local_200._8_8_ = &sint;
    local_1f0 = &cost;
    local_1e8 = &cost;
    Fad<float>::operator=
              (&Spq,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                     *)&myset);
    pFVar3 = operator()(this,row,row);
    Fad<float>::operator=(pFVar3,&Spp);
    pFVar3 = operator()(this,lVar6,lVar6);
    Fad<float>::operator=(pFVar3,&Sqq);
    pFVar3 = operator()(this,row,lVar6);
    Fad<float>::operator=(pFVar3,&Spq);
    pFVar3 = operator()(this,lVar6,row);
    Fad<float>::operator=(pFVar3,&Spq);
  }
  if (local_1e0 != (TPZVec<Fad<float>_> *)0x0) {
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &myset._M_t._M_impl.super__Rb_tree_header._M_header;
    myset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar6 = 0; iVar2 = local_1d0, local_1d8 != lVar6; lVar6 = lVar6 + 1) {
      pFVar3 = operator()(this,lVar6,lVar6);
      Fad<float>::Fad(&exps,pFVar3);
      Fad<float>::Fad(&local_50,&exps);
      local_248._0_8_ = (undefined8)local_50.val_;
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
      _M_insert_equal<double>(&myset._M_t,(double *)local_248);
      Fad<float>::~Fad(&local_50);
      Fad<float>::~Fad(&exps);
    }
    (*local_1e0->_vptr_TPZVec[3])(local_1e0,local_1d0);
    p_Var4 = myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar6 = iVar2 << 5;
    while ((_Rb_tree_header *)p_Var4 != &myset._M_t._M_impl.super__Rb_tree_header) {
      Fad<float>::operator=<double,_nullptr>
                ((Fad<float> *)((long)&local_1e0->fStore[-1].val_ + lVar6),(double *)(p_Var4 + 1));
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      lVar6 = lVar6 + -0x20;
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree(&myset._M_t);
  }
  dVar1 = *local_1c8;
  *local_1c8 = (double)ABS(res.val_);
  *local_1c0 = local_1b8;
  Fad<float>::~Fad(&Spq);
  Fad<float>::~Fad(&Sqq);
  Fad<float>::~Fad(&Spp);
  Fad<float>::~Fad(&aux2);
  Fad<float>::~Fad(&aux);
  Fad<float>::~Fad(&sint);
  Fad<float>::~Fad(&cost);
  Fad<float>::~Fad(&theta);
  Fad<float>::~Fad(&maxval);
  Fad<float>::~Fad(&res);
  return (double)ABS(res.val_) < dVar1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}